

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

MultiFab * __thiscall NavierStokesBase::get_rho_half_time(NavierStokesBase *this)

{
  MultiFab *this_00;
  int j;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  Box local_16c;
  Array4<double> local_150;
  Array4<double> local_110;
  Array4<double> local_d0;
  MFIter mfi;
  
  this_00 = &this->rho_half;
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)this_00,true);
  while (mfi.currentIndex < mfi.endIndex) {
    amrex::MFIter::growntilebox(&local_16c,&mfi,-1000000);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_d0,&this_00->super_FabArray<amrex::FArrayBox>,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_110,&(this->rho_ptime).super_FabArray<amrex::FArrayBox>,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_150,&(this->rho_ctime).super_FabArray<amrex::FArrayBox>,&mfi);
    lVar8 = (long)local_16c.smallend.vect[1];
    lVar9 = (long)local_16c.smallend.vect[2];
    lVar6 = (long)local_16c.smallend.vect[0];
    lVar4 = (lVar8 - local_d0.begin.y) * local_d0.jstride * 8 +
            (lVar9 - local_d0.begin.z) * local_d0.kstride * 8 + lVar6 * 8 +
            (long)local_d0.begin.x * -8 + (long)local_d0.p;
    lVar3 = (lVar8 - local_150.begin.y) * local_150.jstride * 8 +
            (lVar9 - local_150.begin.z) * local_150.kstride * 8 + lVar6 * 8 +
            (long)local_150.begin.x * -8 + (long)local_150.p;
    lVar6 = (lVar8 - local_110.begin.y) * local_110.jstride * 8 +
            (lVar9 - local_110.begin.z) * local_110.kstride * 8 + lVar6 * 8 +
            (long)local_110.begin.x * -8 + (long)local_110.p;
    for (; lVar1 = lVar8, lVar2 = lVar3, lVar7 = lVar4, lVar10 = lVar6,
        lVar9 <= local_16c.bigend.vect[2]; lVar9 = lVar9 + 1) {
      for (; lVar1 <= local_16c.bigend.vect[1]; lVar1 = lVar1 + 1) {
        if (local_16c.smallend.vect[0] <= local_16c.bigend.vect[0]) {
          lVar5 = 0;
          do {
            *(double *)(lVar7 + lVar5 * 8) =
                 (*(double *)(lVar10 + lVar5 * 8) + *(double *)(lVar2 + lVar5 * 8)) * 0.5;
            lVar5 = lVar5 + 1;
          } while ((local_16c.bigend.vect[0] - local_16c.smallend.vect[0]) + 1 != (int)lVar5);
        }
        lVar2 = lVar2 + local_150.jstride * 8;
        lVar7 = lVar7 + local_d0.jstride * 8;
        lVar10 = lVar10 + local_110.jstride * 8;
      }
      lVar4 = lVar4 + local_d0.kstride * 8;
      lVar3 = lVar3 + local_150.kstride * 8;
      lVar6 = lVar6 + local_110.kstride * 8;
    }
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  return this_00;
}

Assistant:

MultiFab&
NavierStokesBase::get_rho_half_time ()
{
    //
    // Fill it in when needed ...
    //
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(rho_half,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox();
        auto const& rho_h = rho_half.array(mfi);
        auto const& rho_p = rho_ptime.array(mfi);
        auto const& rho_c = rho_ctime.array(mfi);
        amrex::ParallelFor(bx, [rho_h, rho_p, rho_c]
        AMREX_GPU_DEVICE(int i, int j, int k) noexcept
        {
           rho_h(i,j,k) = 0.5 * (rho_p(i,j,k) + rho_c(i,j,k));
        });
    }
    return rho_half;
}